

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O3

pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
 __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::insert(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *this,value_type entry)

{
  undefined4 uVar1;
  undefined4 uVar2;
  data_ptr_t __dest;
  undefined8 __src;
  ulong size;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::string_t,_unsigned_long>,_false,_true>,_bool>
  pVar3;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined8 local_48;
  data_ptr_t local_40;
  unsigned_long local_38;
  
  uVar1 = entry.first.value.pointer.length;
  __src = entry.first.value.pointer.ptr;
  if ((uint)entry.first.value._0_4_ < 0xd) {
    pVar3 = ::std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t_const,unsigned_long>>
                      ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->map,&entry);
  }
  else {
    local_48 = entry.first.value._0_8_;
    local_40 = (data_ptr_t)entry.first.value.pointer.ptr;
    size = local_48 & 0xffffffff;
    __dest = Allocator::AllocateData(this->allocator,size);
    if ((uint)uVar1 < 0xd) {
      __src = (char *)((long)&local_48 + 4);
    }
    switchD_015de399::default(__dest,(void *)__src,size);
    if ((uint)uVar1 < 0xd) {
      local_50 = 0;
      local_58 = 0;
      uStack_54 = 0;
      if (uVar1 == 0) {
        uVar2 = 0;
        __dest = (data_ptr_t)0x0;
      }
      else {
        switchD_015de399::default(&local_58,(void *)((long)&local_48 + 4),size);
        __dest = (data_ptr_t)CONCAT44(local_50,uStack_54);
        uVar2 = local_58;
      }
    }
    else {
      uVar2 = *(undefined4 *)__dest;
    }
    local_48 = CONCAT44(uVar2,uVar1);
    local_38 = entry.second;
    local_40 = __dest;
    pVar3 = ::std::
            _Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::string_t,unsigned_long>>
                      ((_Hashtable<duckdb::string_t,std::pair<duckdb::string_t_const,unsigned_long>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>,std::__detail::_Select1st,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->map);
  }
  return pVar3;
}

Assistant:

pair<iterator, bool> insert(value_type entry) { // NOLINT: match std style
		if (entry.first.IsInlined()) {
			return map.insert(std::move(entry));
		} else {
			return map.insert(make_pair(CopyString(entry.first), std::move(entry.second)));
		}
	}